

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O2

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::createImage(toktxApp *this,targetImageSpec *target,ImageInput *in)

{
  float fVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ktx_uint32_t height;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  FormatDescriptor *this_00;
  ulong uVar8;
  ostream *poVar9;
  runtime_error *this_01;
  long *in_RCX;
  pointer puVar10;
  pointer puVar11;
  pointer local_258;
  pointer local_250;
  uint local_248 [8];
  FormatDescriptor inputFormat;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bits;
  
  this_00 = (FormatDescriptor *)(**(code **)(*in_RCX + 0x70))();
  inputFormat.extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&inputFormat.extended.iccProfile.name.field_2;
  inputFormat.basic._0_8_ = 0;
  inputFormat.basic._8_5_ = 0;
  inputFormat.basic._13_3_ = 0;
  inputFormat.extended.channelCount = 0;
  inputFormat.extended.sameUnitAllChannels = false;
  inputFormat.extended.oeGamma = -1.0;
  inputFormat.extended.iccProfile.name._M_string_length = 0;
  inputFormat.extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  inputFormat.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inputFormat.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inputFormat.extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inputFormat.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
  inputFormat.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputFormat.samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(uint32_t *)&in->field_0x10 == (this_00->extended).channelCount) {
    FormatDescriptor::operator=(&inputFormat,(FormatDescriptor *)in);
  }
  else {
    FormatDescriptor::operator=(&inputFormat,this_00);
    uVar6 = FormatDescriptor::channelBitLength((FormatDescriptor *)in);
    bVar5 = FormatDescriptor::anyChannelBitLengthNotEqual(this_00,uVar6);
    if (bVar5) {
      bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&bits,1);
      uVar6 = FormatDescriptor::channelBitLength((FormatDescriptor *)in);
      *bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = uVar6;
      FormatDescriptor::updateSampleBitCounts
                (&inputFormat,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  uVar6 = FormatDescriptor::channelBitLength(&inputFormat);
  if (uVar6 != 0x10) {
    uVar6 = FormatDescriptor::channelBitLength((FormatDescriptor *)in);
    if (uVar6 != 8) {
      std::__cxx11::stringstream::stringstream((stringstream *)&bits);
      bVar2 = ((this_00->samples).
               super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x3;
      poVar9 = std::operator<<((ostream *)
                               &bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Unsupported format ");
      FormatDescriptor::channelBitLength(this_00);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,"-bit ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,bVar2 & 0xf);
      std::operator<<(poVar9," needed.");
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_01,(string *)local_248);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    switch(inputFormat.extended.channelCount) {
    case 1:
      local_248[0] = *(uint *)&this_00[1].basic;
      std::make_unique<ImageT<unsigned_char,1u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
      break;
    case 2:
      local_248[0] = *(uint *)&this_00[1].basic;
      std::make_unique<ImageT<unsigned_char,2u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
      break;
    case 3:
      local_248[0] = *(uint *)&this_00[1].basic;
      std::make_unique<ImageT<unsigned_char,3u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
      break;
    case 4:
      local_248[0] = *(uint *)&this_00[1].basic;
      std::make_unique<ImageT<unsigned_char,4u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
      break;
    default:
      goto switchD_0010fbf7_default;
    }
    goto LAB_0010fd5f;
  }
  switch(inputFormat.extended.channelCount) {
  case 1:
    local_248[0] = *(uint *)&this_00[1].basic;
    std::make_unique<ImageT<unsigned_short,1u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
    break;
  case 2:
    local_248[0] = *(uint *)&this_00[1].basic;
    std::make_unique<ImageT<unsigned_short,2u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
    break;
  case 3:
    local_248[0] = *(uint *)&this_00[1].basic;
    std::make_unique<ImageT<unsigned_short,3u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
    break;
  case 4:
    local_248[0] = *(uint *)&this_00[1].basic;
    std::make_unique<ImageT<unsigned_short,4u>,unsigned_int,unsigned_int>((uint *)&bits,local_248);
    break;
  default:
switchD_0010fbf7_default:
    puVar11 = (pointer)0x0;
    goto LAB_0010fd6f;
  }
LAB_0010fd5f:
  (this->super_scApp).super_ktxApp._vptr_ktxApp =
       (_func_int **)
       bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  puVar11 = bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
LAB_0010fd6f:
  (**(code **)(*(long *)puVar11 + 0x10))(puVar11);
  (**(code **)(*(long *)puVar11 + 0x18))(puVar11);
  (**(code **)(*in_RCX + 0xb8))();
  uVar3 = puVar11[2];
  uVar4 = puVar11[3];
  iVar7 = (**(code **)(*(long *)puVar11 + 0x20))(puVar11);
  uVar8 = (**(code **)(*(long *)puVar11 + 0x18))(puVar11);
  if (uVar8 != uVar4 * uVar3 * iVar7) {
    __assert_fail("image->getWidth() * image->getHeight() * image->getPixelSize() == image->getByteCount()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                  ,0x440,
                  "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)");
  }
  if (*(long *)&in->field_0x90 != 0) {
    if (*(long *)&in->field_0x88 == 0) {
      __assert_fail("target.srcTransferFunction != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                    ,0x445,
                    "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)"
                   );
    }
    if (*(ColorPrimaries **)&in->field_0xa0 == (ColorPrimaries *)0x0) {
      (**(code **)(*(long *)puVar11 + 0x98))
                (puVar11,*(long *)&in->field_0x88,*(long *)&in->field_0x90,0);
    }
    else {
      if (*(ColorPrimaries **)&in->field_0x98 == (ColorPrimaries *)0x0) {
        __assert_fail("target.srcColorPrimaries != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x447,
                      "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)"
                     );
      }
      ColorPrimaries::transformTo
                ((ColorPrimaryTransform *)&bits,*(ColorPrimaries **)&in->field_0x98,
                 *(ColorPrimaries **)&in->field_0xa0);
      (**(code **)(*(long *)puVar11 + 0x98))
                (puVar11,*(undefined8 *)&in->field_0x88,*(undefined8 *)&in->field_0x90,&bits);
    }
  }
  puVar11[5] = (uint)*(byte *)((long)&in->_vptr_ImageInput + 1);
  puVar11[4] = (uint)*(byte *)((long)&in->_vptr_ImageInput + 2);
  fVar1 = *(float *)((long)&target[4].super_ImageSpec.formatDesc.extended.iccProfile.profile.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + 0xc);
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    uVar3 = puVar11[2];
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    local_250 = puVar11;
    scaleImage((toktxApp *)&bits,(unique_ptr<Image,_std::default_delete<Image>_> *)target,
               (ktx_uint32_t)&local_250,(ktx_uint32_t)(long)((float)uVar3 * fVar1));
    (this->super_scApp).super_ktxApp._vptr_ktxApp =
         (_func_int **)
         bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar10 = local_250;
  }
  else {
    if ((*(int *)((long)&target[4].super_ImageSpec.formatDesc.extended.iccProfile.profile.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 0x10) == 0) ||
       ((height = *(ktx_uint32_t *)&in->field_0x70, puVar11[2] == height &&
        (puVar11[3] == *(uint *)&in->field_0x74)))) goto LAB_0010ff31;
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    local_258 = puVar11;
    scaleImage((toktxApp *)&bits,(unique_ptr<Image,_std::default_delete<Image>_> *)target,
               (ktx_uint32_t)&local_258,height);
    (this->super_scApp).super_ktxApp._vptr_ktxApp =
         (_func_int **)
         bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar10 = local_258;
  }
  puVar11 = bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (puVar10 != (pointer)0x0) {
    (**(code **)(*(long *)puVar10 + 8))();
  }
LAB_0010ff31:
  if (target[4].usedInputTransferFunction != KHR_DF_TRANSFER_UNSPECIFIED) {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    convertImageType((toktxApp *)&bits,(unique_ptr<Image,_std::default_delete<Image>_> *)target);
    puVar10 = bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)puVar10;
    if (puVar11 != (pointer)0x0) {
      (**(code **)(*(long *)puVar11 + 8))();
    }
  }
  FormatDescriptor::~FormatDescriptor(&inputFormat);
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

unique_ptr<Image>
toktxApp::createImage(const targetImageSpec& target, ImageInput& in)
{
    const ImageSpec& inSpec = in.spec();
    FormatDescriptor inputFormat;
    unique_ptr<Image> image;

    // input plugins that support channel reduction and addition do so
    // in a way which differs from the documented behaviour for --target_type
    // so alway do channel adjustments in this program.
    if (target.format().channelCount() != inSpec.format().channelCount()) {
        // Have plugin deliver all channels.
        inputFormat = inSpec.format();
        if (inSpec.format().anyChannelBitLengthNotEqual(target.format().channelBitLength())) {
            // target.format() is set so all channels have same bit length.
            std::vector<uint32_t> bits;
            bits.resize(1);
            bits[0] = target.format().channelBitLength();
            // TODO: Consider making a function for channelBitCounts.
            // Currently supported input formats all have
            // numChannels = numSamples so this works but is fragile.
            inputFormat.updateSampleBitCounts(bits);
        }
    } else {
        inputFormat = target.format();
    }
    //if (target.format().channelBitLength() == 16) {
    if (inputFormat.channelBitLength() == 16) {
        switch (inputFormat.channelCount()) {
          case 1: {
            image = make_unique<r16image>(inSpec.width(), inSpec.height());
            break;
          } case 2: {
            image = make_unique<rg16image>(inSpec.width(), inSpec.height());
            break;
          } case 3: {
            image = make_unique<rgb16image>(inSpec.width(), inSpec.height());
            break;
          } case 4: {
            image = make_unique<rgba16image>(inSpec.width(), inSpec.height());
            break;
          }
        }
    } else if (target.format().channelBitLength() == 8) {
        switch (inputFormat.channelCount()) {
          case 1: {
            image = make_unique<r8image>(inSpec.width(), inSpec.height());
            break;
          } case 2: {
            image = make_unique<rg8image>(inSpec.width(), inSpec.height());
            break;
          } case 3: {
            image = make_unique<rgb8image>(inSpec.width(), inSpec.height());
            break;
          } case 4: {
            image = make_unique<rgba8image>(inSpec.width(), inSpec.height());
            break;
          }
        }
    } else {
        stringstream message;
        uint32_t ct = inSpec.format().samples[0].channelType;
        khr_df_sample_datatype_qualifiers_e dtq;
        dtq = static_cast<khr_df_sample_datatype_qualifiers_e>(ct);
        message << "Unsupported format "
                << inSpec.format().channelBitLength()
                << "-bit " << dtq << " needed.";
        throw runtime_error(message.str());
        // TODO: uint32, uint64, float etc.
    }

    in.readImage(static_cast<uint8_t*>(*image), image->getByteCount(),
                  0/*subimage*/, 0/*miplevel*/, inputFormat);
    /* Sanity check. */
    assert(image->getWidth() * image->getHeight() * image->getPixelSize()
           == image->getByteCount());



    if (target.dstTransferFunction != nullptr) {
        assert(target.srcTransferFunction != nullptr);
        if (target.dstColorPrimaries != nullptr) {
            assert(target.srcColorPrimaries != nullptr);
            auto primaryTransform = target.srcColorPrimaries->transformTo(*target.dstColorPrimaries);

            // Transform OETF with primary transform
            image->transformColorSpace(*target.srcTransferFunction, *target.dstTransferFunction, &primaryTransform);
        } else {
            // Transform OETF without primary transform
            image->transformColorSpace(*target.srcTransferFunction, *target.dstTransferFunction);
        }
    }
    image->setPrimaries((khr_df_primaries_e)target.format().primaries());
    image->setTransferFunction((khr_df_transfer_e)target.format().transfer());

    if (options.scale != 1.0f) {
        auto scaledWidth = image->getWidth() * options.scale;
        auto scaledHeight = image->getHeight() * options.scale;
        image = scaleImage(std::move(image),
               static_cast<ktx_uint32_t>(scaledWidth),
               static_cast<ktx_uint32_t>(scaledHeight));
    } else if (options.resize
               && (image->getWidth() != target.width()
                   || image->getHeight() != target.height()))
    {
        // --resize is not allowed with --mipmap so createImage will never be
        // called for other than the base level when set. This would be
        // incorrect otherwise. target reflects the resize value, if any.
        image = scaleImage(std::move(image), target.width(), target.height());
    }
    if (options.targetType != commandOptions::eUnspecified) {
        image = convertImageType(std::move(image));
    }
    return image;
}